

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

ostream * mjs::operator<<(ostream *os,token_type t)

{
  long lVar1;
  char *pcVar2;
  
  switch(t) {
  case whitespace:
    pcVar2 = "whitespace";
    goto LAB_00172873;
  case line_terminator:
    pcVar2 = "line_terminator";
    goto LAB_00172751;
  case identifier:
    pcVar2 = "identifier";
    goto LAB_00172873;
  case numeric_literal:
    pcVar2 = "numeric_literal";
    goto LAB_00172751;
  case string_literal:
    pcVar2 = "string_literal";
    lVar1 = 0xe;
    goto LAB_00172a30;
  case rshiftshiftequal:
    pcVar2 = "rshiftshiftequal";
    lVar1 = 0x10;
    goto LAB_00172a30;
  case rshiftshift:
    pcVar2 = "rshiftshift";
    goto LAB_0017282d;
  case lshiftequal:
    pcVar2 = "lshiftequal";
    goto LAB_0017282d;
  case rshiftequal:
    pcVar2 = "rshiftequal";
    goto LAB_0017282d;
  case equalequalequal:
    pcVar2 = "equalequalequal";
LAB_00172751:
    lVar1 = 0xf;
    goto LAB_00172a30;
  case notequalequal:
    pcVar2 = "notequalequal";
    goto LAB_0017290d;
  case equalequal:
    pcVar2 = "equalequal";
    goto LAB_00172873;
  case notequal:
    pcVar2 = "notequal";
    goto LAB_001729ba;
  case ltequal:
    pcVar2 = "ltequal";
    goto LAB_0017299b;
  case gtequal:
    pcVar2 = "gtequal";
    goto LAB_0017299b;
  case andand:
    pcVar2 = "andand";
    break;
  case oror:
    pcVar2 = "oror";
    goto LAB_00172a03;
  case plusplus:
    pcVar2 = "plusplus";
    goto LAB_001729ba;
  case minusminus:
    pcVar2 = "minusminus";
    goto LAB_00172873;
  case lshift:
    pcVar2 = "lshift";
    break;
  case rshift:
    pcVar2 = "rshift";
    break;
  case plusequal:
    pcVar2 = "plusequal";
    goto LAB_001729ac;
  case minusequal:
    pcVar2 = "minusequal";
    goto LAB_00172873;
  case multiplyequal:
    pcVar2 = "multiplyequal";
LAB_0017290d:
    lVar1 = 0xd;
    goto LAB_00172a30;
  case divideequal:
    pcVar2 = "divideequal";
LAB_0017282d:
    lVar1 = 0xb;
    goto LAB_00172a30;
  case andequal:
    pcVar2 = "andequal";
    goto LAB_001729ba;
  case orequal:
    pcVar2 = "orequal";
    goto LAB_0017299b;
  case xorequal:
    pcVar2 = "xorequal";
    goto LAB_001729ba;
  case modequal:
    pcVar2 = "modequal";
    goto LAB_001729ba;
  case equal:
    pcVar2 = "equal";
    goto LAB_00172981;
  case gt:
    pcVar2 = "gt";
    goto LAB_0017283e;
  case lt:
    pcVar2 = "lt";
    goto LAB_0017283e;
  case comma:
    pcVar2 = "comma";
    goto LAB_00172981;
  case not_:
    pcVar2 = "not_";
    goto LAB_00172a03;
  case tilde:
    pcVar2 = "tilde";
    goto LAB_00172981;
  case question:
    pcVar2 = "question";
    goto LAB_001729ba;
  case colon:
    pcVar2 = "colon";
    goto LAB_00172981;
  case dot:
    pcVar2 = "dot";
    goto LAB_00172a11;
  case plus:
    pcVar2 = "plus";
    goto LAB_00172a03;
  case minus:
    pcVar2 = "minus";
    goto LAB_00172981;
  case multiply:
    pcVar2 = "multiply";
    goto LAB_001729ba;
  case divide:
    pcVar2 = "divide";
    break;
  case and_:
    pcVar2 = "and_";
    goto LAB_00172a03;
  case or_:
    pcVar2 = "or_";
    goto LAB_00172a11;
  case xor_:
    pcVar2 = "xor_";
    goto LAB_00172a03;
  case mod:
    pcVar2 = "mod";
    goto LAB_00172a11;
  case lparen:
    pcVar2 = "lparen";
    break;
  case rparen:
    pcVar2 = "rparen";
    break;
  case lbrace:
    pcVar2 = "lbrace";
    break;
  case rbrace:
    pcVar2 = "rbrace";
    break;
  case lbracket:
    pcVar2 = "lbracket";
    goto LAB_001729ba;
  case rbracket:
    pcVar2 = "rbracket";
    goto LAB_001729ba;
  case semicolon:
    pcVar2 = "semicolon";
    goto LAB_001729ac;
  case abstract_:
    pcVar2 = "abstract";
    goto LAB_001729ba;
  case boolean_:
    pcVar2 = "boolean";
    goto LAB_0017299b;
  case break_:
    pcVar2 = "break";
    goto LAB_00172981;
  case byte_:
    pcVar2 = "byte";
    goto LAB_00172a03;
  case case_:
    pcVar2 = "case";
    goto LAB_00172a03;
  case catch_:
    pcVar2 = "catch";
    goto LAB_00172981;
  case char_:
    pcVar2 = "char";
    goto LAB_00172a03;
  case class_:
    pcVar2 = "class";
    goto LAB_00172981;
  case const_:
    pcVar2 = "const";
    goto LAB_00172981;
  case continue_:
    pcVar2 = "continue";
    goto LAB_001729ba;
  case debugger_:
    pcVar2 = "debugger";
    goto LAB_001729ba;
  case default_:
    pcVar2 = "default";
    goto LAB_0017299b;
  case delete_:
    pcVar2 = "delete";
    break;
  case do_:
    pcVar2 = "do";
    goto LAB_0017283e;
  case double_:
    pcVar2 = "double";
    break;
  case else_:
    pcVar2 = "else";
    goto LAB_00172a03;
  case enum_:
    pcVar2 = "enum";
    goto LAB_00172a03;
  case export_:
    pcVar2 = "export";
    break;
  case extends_:
    pcVar2 = "extends";
    goto LAB_0017299b;
  case false_:
    pcVar2 = "false";
    goto LAB_00172981;
  case final_:
    pcVar2 = "final";
    goto LAB_00172981;
  case finally_:
    pcVar2 = "finally";
    goto LAB_0017299b;
  case float_:
    pcVar2 = "float";
    goto LAB_00172981;
  case for_:
    pcVar2 = "for";
    goto LAB_00172a11;
  case function_:
    pcVar2 = "function";
    goto LAB_001729ba;
  case goto_:
    pcVar2 = "goto";
    goto LAB_00172a03;
  case if_:
    pcVar2 = "if";
    goto LAB_0017283e;
  case implements_:
    pcVar2 = "implements";
    goto LAB_00172873;
  case import_:
    pcVar2 = "import";
    break;
  case in_:
    pcVar2 = "in";
LAB_0017283e:
    lVar1 = 2;
    goto LAB_00172a30;
  case instanceof_:
    pcVar2 = "instanceof";
LAB_00172873:
    lVar1 = 10;
    goto LAB_00172a30;
  case int_:
    pcVar2 = "int";
    goto LAB_00172a11;
  case interface_:
    pcVar2 = "interface";
    goto LAB_001729ac;
  case let_:
    pcVar2 = "let";
    goto LAB_00172a11;
  case long_:
    pcVar2 = "long";
    goto LAB_00172a03;
  case native_:
    pcVar2 = "native";
    break;
  case new_:
    pcVar2 = "new";
    goto LAB_00172a11;
  case null_:
    pcVar2 = "null";
    goto LAB_00172a03;
  case package_:
    pcVar2 = "package";
    goto LAB_0017299b;
  case private_:
    pcVar2 = "private";
LAB_0017299b:
    lVar1 = 7;
    goto LAB_00172a30;
  case protected_:
    pcVar2 = "protected";
    goto LAB_001729ac;
  case public_:
    pcVar2 = "public";
    break;
  case return_:
    pcVar2 = "return";
    break;
  case short_:
    pcVar2 = "short";
    goto LAB_00172981;
  case static_:
    pcVar2 = "static";
    break;
  case super_:
    pcVar2 = "super";
    goto LAB_00172981;
  case switch_:
    pcVar2 = "switch";
    break;
  case synchronized_:
    pcVar2 = "synchronized";
    lVar1 = 0xc;
    goto LAB_00172a30;
  case this_:
    pcVar2 = "this";
    goto LAB_00172a03;
  case throw_:
    pcVar2 = "throw";
    goto LAB_00172981;
  case throws_:
    pcVar2 = "throws";
    break;
  case transient_:
    pcVar2 = "transient";
LAB_001729ac:
    lVar1 = 9;
    goto LAB_00172a30;
  case true_:
    pcVar2 = "true";
    goto LAB_00172a03;
  case try_:
    pcVar2 = "try";
    goto LAB_00172a11;
  case typeof_:
    pcVar2 = "typeof";
    break;
  case var_:
    pcVar2 = "var";
    goto LAB_00172a11;
  case void_:
    pcVar2 = "void";
    goto LAB_00172a03;
  case volatile_:
    pcVar2 = "volatile";
LAB_001729ba:
    lVar1 = 8;
    goto LAB_00172a30;
  case while_:
    pcVar2 = "while";
    goto LAB_00172981;
  case with_:
    pcVar2 = "with";
LAB_00172a03:
    lVar1 = 4;
    goto LAB_00172a30;
  case yield_:
    pcVar2 = "yield";
LAB_00172981:
    lVar1 = 5;
    goto LAB_00172a30;
  case eof:
    pcVar2 = "eof";
LAB_00172a11:
    lVar1 = 3;
    goto LAB_00172a30;
  default:
    std::__ostream_insert<char,std::char_traits<char>>(os,"token_type{",0xb);
    os = (ostream *)std::ostream::operator<<((ostream *)os,t);
    pcVar2 = "}";
    lVar1 = 1;
    goto LAB_00172a30;
  }
  lVar1 = 6;
LAB_00172a30:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, token_type t) {
    switch (t) {
#define CASE_TOKEN_TYPE(n) case token_type::n: return os << #n;
        CASE_TOKEN_TYPE(whitespace)
        CASE_TOKEN_TYPE(line_terminator)
        CASE_TOKEN_TYPE(identifier)
        CASE_TOKEN_TYPE(numeric_literal)
        CASE_TOKEN_TYPE(string_literal)
        CASE_TOKEN_TYPE(eof)
#undef CASE_TOKEN_TYPE
#define CASE_PUNCTUATOR(n, ...) case token_type::n: return os << #n;
        MJS_PUNCTUATORS(CASE_PUNCTUATOR)
#undef CASE_PUNCTUATOR
#define CASE_KEYWORD(n, ...) case token_type::n ## _: return os << #n;
        MJS_KEYWORDS(CASE_KEYWORD)
#undef CASE_KEYWORD
    }
    return os << "token_type{" << (int)t << "}";
}